

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSplit.c
# Opt level: O0

DdNode * Cudd_SplitSet(DdManager *manager,DdNode *S,DdNode **xVars,int n,double m)

{
  int iVar1;
  DdNode *pDVar2;
  int *varSeen_00;
  st__table *table;
  double max_00;
  double dVar3;
  int size;
  int index;
  int i;
  int *varSeen;
  st__table *mtable;
  double num;
  double max;
  DdNode *one;
  DdNode *zero;
  DdNode *result;
  double m_local;
  int n_local;
  DdNode **xVars_local;
  DdNode *S_local;
  DdManager *manager_local;
  
  iVar1 = manager->size;
  pDVar2 = manager->one;
  manager_local = (DdManager *)((ulong)pDVar2 ^ 1);
  if ((m != 0.0) || (NAN(m))) {
    if ((DdManager *)S == manager_local) {
      manager_local = (DdManager *)0x0;
    }
    else {
      max_00 = pow(2.0,(double)n);
      if (m <= max_00) {
        do {
          manager->reordered = 0;
          varSeen_00 = (int *)malloc((long)iVar1 << 2);
          if (varSeen_00 == (int *)0x0) {
            manager->errorCode = CUDD_MEMORY_OUT;
            return (DdNode *)0x0;
          }
          for (size = 0; size < iVar1; size = size + 1) {
            varSeen_00[size] = -1;
          }
          for (size = 0; size < n; size = size + 1) {
            varSeen_00[manager->invperm[(int)xVars[size]->index]] = 0;
          }
          if (S == pDVar2) {
            if ((m == max_00) && (!NAN(m) && !NAN(max_00))) {
              if (varSeen_00 == (int *)0x0) {
                return S;
              }
              free(varSeen_00);
              return S;
            }
            zero = selectMintermsFromUniverse(manager,varSeen_00,m);
            if (zero != (DdNode *)0x0) {
              *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + 1;
            }
            if (varSeen_00 != (int *)0x0) {
              free(varSeen_00);
            }
          }
          else {
            table = st__init_table(st__ptrcmp,st__ptrhash);
            if (table == (st__table *)0x0) {
              fprintf((FILE *)manager->out,"Cudd_SplitSet: out-of-memory.\n");
              if (varSeen_00 != (int *)0x0) {
                free(varSeen_00);
              }
              manager->errorCode = CUDD_MEMORY_OUT;
              return (DdNode *)0x0;
            }
            dVar3 = bddAnnotateMintermCount(manager,S,max_00,table);
            if ((m == dVar3) && (!NAN(m) && !NAN(dVar3))) {
              st__foreach(table,cuddStCountfree,(char *)0x0);
              st__free_table(table);
              if (varSeen_00 == (int *)0x0) {
                return S;
              }
              free(varSeen_00);
              return S;
            }
            zero = cuddSplitSetRecur(manager,table,varSeen_00,S,m,max_00,0);
            if (zero != (DdNode *)0x0) {
              *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + 1;
            }
            st__foreach(table,cuddStCountfree,(char *)0x0);
            st__free_table(table);
            if (varSeen_00 != (int *)0x0) {
              free(varSeen_00);
            }
          }
        } while (manager->reordered == 1);
        *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)zero & 0xfffffffffffffffe) + 4) + -1;
        manager_local = (DdManager *)zero;
      }
      else {
        manager_local = (DdManager *)0x0;
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
Cudd_SplitSet(
  DdManager * manager,
  DdNode * S,
  DdNode ** xVars,
  int  n,
  double  m)
{
    DdNode *result;
    DdNode *zero, *one;
    double  max, num;
    st__table *mtable;
    int *varSeen;
    int i,index, size;

    size = manager->size;
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Trivial cases. */
    if (m == 0.0) {
        return(zero);
    }
    if (S == zero) {
        return(NULL);
    }

    max = pow(2.0,(double)n);
    if (m > max)
        return(NULL);

    do {
        manager->reordered = 0;
        /* varSeen is used to mark the variables that are encountered
        ** while traversing the BDD S.
        */
        varSeen = ABC_ALLOC(int, size);
        if (varSeen == NULL) {
            manager->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (i = 0; i < size; i++) {
            varSeen[i] = -1;
        }
        for (i = 0; i < n; i++) {
            index = (xVars[i])->index;
            varSeen[manager->invperm[index]] = 0;
        }

        if (S == one) {
            if (m == max) {
                ABC_FREE(varSeen);
                return(S);
            }
            result = selectMintermsFromUniverse(manager,varSeen,m);
            if (result)
                cuddRef(result);
            ABC_FREE(varSeen);
        } else {
            mtable = st__init_table( st__ptrcmp, st__ptrhash);
            if (mtable == NULL) {
                (void) fprintf(manager->out,
                               "Cudd_SplitSet: out-of-memory.\n");
                ABC_FREE(varSeen);
                manager->errorCode = CUDD_MEMORY_OUT;
                return(NULL);
            }
            /* The nodes of BDD S are annotated by the number of minterms
            ** in their onset. The node and the number of minterms in its
            ** onset are stored in mtable.
            */
            num = bddAnnotateMintermCount(manager,S,max,mtable);
            if (m == num) {
                st__foreach(mtable,cuddStCountfree,NIL(char));
                st__free_table(mtable);
                ABC_FREE(varSeen);
                return(S);
            }
            
            result = cuddSplitSetRecur(manager,mtable,varSeen,S,m,max,0);
            if (result)
                cuddRef(result);
            st__foreach(mtable,cuddStCountfree,NULL);
            st__free_table(mtable);
            ABC_FREE(varSeen);
        }
    } while (manager->reordered == 1);

    cuddDeref(result);
    return(result);

}